

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_parity_s256_256_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint j;
  ulong uVar4;
  long lVar5;
  mzd_local_t *pmVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar1 = *(undefined1 (*) [32])v->w64;
  pmVar6 = At + 2;
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar9[8] = 0xf;
  auVar9._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar9[9] = 0xf;
  auVar9[10] = 0xf;
  auVar9[0xb] = 0xf;
  auVar9[0xc] = 0xf;
  auVar9[0xd] = 0xf;
  auVar9[0xe] = 0xf;
  auVar9[0xf] = 0xf;
  auVar9[0x10] = 0xf;
  auVar9[0x11] = 0xf;
  auVar9[0x12] = 0xf;
  auVar9[0x13] = 0xf;
  auVar9[0x14] = 0xf;
  auVar9[0x15] = 0xf;
  auVar9[0x16] = 0xf;
  auVar9[0x17] = 0xf;
  auVar9[0x18] = 0xf;
  auVar9[0x19] = 0xf;
  auVar9[0x1a] = 0xf;
  auVar9[0x1b] = 0xf;
  auVar9[0x1c] = 0xf;
  auVar9[0x1d] = 0xf;
  auVar9[0x1e] = 0xf;
  auVar9[0x1f] = 0xf;
  auVar10._16_16_ = _DAT_001064a0;
  auVar10._0_16_ = _DAT_001064a0;
  auVar11._8_8_ = 2;
  auVar11._0_8_ = 2;
  auVar11._16_8_ = 2;
  auVar11._24_8_ = 2;
  auVar12._8_8_ = 1;
  auVar12._0_8_ = 1;
  auVar12._16_8_ = 1;
  auVar12._24_8_ = 1;
  auVar13._8_8_ = 4;
  auVar13._0_8_ = 4;
  auVar13._16_8_ = 4;
  auVar13._24_8_ = 4;
  uVar4 = 0x22;
  while (uVar4 != 0x40) {
    auVar7 = vpand_avx2(auVar1,*(undefined1 (*) [32])pmVar6[-2].w64);
    auVar17 = vpand_avx2(auVar1,*(undefined1 (*) [32])pmVar6[-1].w64);
    auVar3 = vpand_avx2(auVar1,*(undefined1 (*) [32])pmVar6->w64);
    pmVar6 = pmVar6 + 3;
    auVar15 = vpsrld_avx2(auVar7,4);
    auVar7 = vpand_avx2(auVar7,auVar9);
    auVar15 = vpand_avx2(auVar15,auVar9);
    auVar7 = vpshufb_avx2(auVar10,auVar7);
    auVar15 = vpshufb_avx2(auVar10,auVar15);
    auVar15 = vpsadbw_avx2(auVar15,auVar7);
    auVar16 = vpsrld_avx2(auVar17,4);
    auVar7 = vpand_avx2(auVar17,auVar9);
    auVar17 = vpand_avx2(auVar16,auVar9);
    auVar7 = vpshufb_avx2(auVar10,auVar7);
    auVar17 = vpshufb_avx2(auVar10,auVar17);
    auVar16 = vpsadbw_avx2(auVar7,auVar17);
    auVar17 = vpsrld_avx2(auVar3,4);
    auVar7 = vpand_avx2(auVar3,auVar9);
    auVar17 = vpand_avx2(auVar17,auVar9);
    auVar3 = vpshufb_avx2(auVar10,auVar7);
    auVar17 = vpshufb_avx2(auVar10,auVar17);
    auVar7 = vpaddq_avx2(auVar16,auVar16);
    auVar17 = vpsadbw_avx2(auVar3,auVar17);
    auVar7 = vpand_avx2(auVar7,auVar11);
    auVar7 = vpternlogq_avx512vl(auVar7,auVar15,auVar12,0xf8);
    auVar17 = vpsllq_avx2(auVar17,2);
    auVar7 = vpternlogq_avx512vl(auVar17,auVar7,auVar13,0xec);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar4;
    auVar7 = vpsllq_avx2(auVar7,auVar14);
    auVar8 = ZEXT3264(auVar7 ^ auVar8._0_32_);
    uVar4 = uVar4 + 3;
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    c->w64[lVar5] = 0;
  }
  auVar2 = auVar8._0_16_ ^ auVar8._16_16_;
  auVar14 = vpshufd_avx(auVar2,0xee);
  c->w64[3] = auVar2._0_8_ ^ auVar14._0_8_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_parity_s256_256_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  const word256 vblock = mm256_load(v->w64);
  word256 res          = mm256_zero;
  // process 3 rows at a time
  for (unsigned int i = 30; i; i -= 3) {
    const word256 Ablock1 = mm256_and(vblock, mm256_load(CONST_BLOCK(At, 30 - i)->w64));
    const word256 Ablock2 = mm256_and(vblock, mm256_load(CONST_BLOCK(At, 30 - i + 1)->w64));
    const word256 Ablock3 = mm256_and(vblock, mm256_load(CONST_BLOCK(At, 30 - i + 2)->w64));

    res = mm256_xor(
        res, _mm256_sll_epi64(mm256_parity_3(Ablock1, Ablock2, Ablock3), _mm_set1_epi64x(64 - i)));
  }

  for (unsigned int j = 0; j < 3; j++) {
    c->w64[j] = 0;
  }

  // combine the parities of each quad word
#if defined(__x86_64__) || defined(_M_X64)
  c->w64[3] = _mm256_extract_epi64(res, 0) ^ _mm256_extract_epi64(res, 1) ^
              _mm256_extract_epi64(res, 2) ^ _mm256_extract_epi64(res, 3);
#else
  // workaround for missing _mm256_extract_epi64 on x86-32
  uint64_t tmp[4] ATTR_ALIGNED(sizeof(word256));
  mm256_store(tmp, res);
  c->w64[3] = tmp[0] ^ tmp[1] ^ tmp[2] ^ tmp[3];
#endif
}